

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
deqp::gles3::Performance::anon_unknown_0::Utils::getFullscreenQuad
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,float depth)

{
  allocator<float> local_79;
  float local_78 [2];
  float data [24];
  float depth_local;
  
  local_78[0] = 1.0;
  local_78[1] = 1.0;
  data[1] = 0.0;
  data[2] = 1.0;
  data[3] = -1.0;
  data[5] = 1.0;
  data[6] = -1.0;
  data[7] = -1.0;
  data[9] = 2.0;
  data[10] = -1.0;
  data[0xb] = -1.0;
  data[0xd] = 0.0;
  data[0xe] = -1.0;
  data[0xf] = 1.0;
  data[0x11] = 1.0;
  data[0x12] = 1.0;
  data[0x13] = 1.0;
  data[0x15] = 2.0;
  data[0] = depth;
  data[4] = depth;
  data[8] = depth;
  data[0xc] = depth;
  data[0x10] = depth;
  data[0x14] = depth;
  data[0x17] = depth;
  std::allocator<float>::allocator(&local_79);
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)__return_storage_ptr__,local_78,data + 0x16,
             &local_79);
  std::allocator<float>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

vector<float> getFullscreenQuad (float depth)
	{
		const float data[] =
		{
			+1.0f, +1.0f, depth, 0.0f, // .w is gl_VertexId%3 since Nexus 4&5 can't handle that on their own
			+1.0f, -1.0f, depth, 1.0f,
			-1.0f, -1.0f, depth, 2.0f,
			-1.0f, -1.0f, depth, 0.0f,
			-1.0f, +1.0f, depth, 1.0f,
			+1.0f, +1.0f, depth, 2.0f,
		};

		return vector<float>(DE_ARRAY_BEGIN(data), DE_ARRAY_END(data));
	}